

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_StoCreateGateAdd(Vec_Mem_t *vTtMem,Vec_Wec_t *vTt2Match,Mio_Cell2_t *pCell,word uTruth,
                        int *pFans,int nFans,Vec_Wec_t *vProfs,Vec_Int_t *vStore,int fPinFilter,
                        int fPinPerm,int fPinQuick)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Vec_Int_t *p;
  ulong uVar5;
  Vec_Int_t *p_00;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong local_38;
  
  uVar8 = (uint)uTruth & 1;
  uVar6 = (ulong)uVar8;
  local_38 = -uVar6 ^ uTruth;
  uVar2 = Vec_MemHashInsert(vTtMem,&local_38);
  if (uVar2 == vTt2Match->nSize) {
    Vec_WecPushLevel(vTt2Match);
  }
  if (((int)uVar2 < 0) || (vTt2Match->nSize <= (int)uVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (*(uint *)&pCell->field_0x10 >> 0x1c != nFans) {
    __assert_fail("nFans == (int)pCell->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                  ,0xc3,
                  "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  p_00 = vTt2Match->pArray + uVar2;
  if (nFans != 0) {
    uVar5 = 0;
    do {
      uVar8 = pFans[uVar5];
      if ((int)uVar8 < 0) goto LAB_0078c03e;
      bVar1 = (byte)(uVar8 >> 1);
      uVar8 = (uint)uVar6 & 0xffffff01 | ((int)uVar5 << (bVar1 * '\x04' & 0x1f)) << 8 |
              (((uVar8 & 1) << (bVar1 & 0x1f)) * 2 | (uint)uVar6) & 0xfe;
      uVar6 = (ulong)uVar8;
      uVar5 = uVar5 + 1;
    } while ((uint)nFans != uVar5);
  }
  if (fPinFilter == 0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    if (vTt2Match->nSize != vProfs->nSize) {
      __assert_fail("Vec_WecSize(vTt2Match) == Vec_WecSize(vProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0xcd,
                    "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    iVar3 = p_00->nSize;
    if (iVar3 != vProfs->pArray[uVar2].nSize * 2) {
      __assert_fail("Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                    ,0xd1,
                    "void Nf_StoCreateGateAdd(Vec_Mem_t *, Vec_Wec_t *, Mio_Cell2_t *, word, int *, int, Vec_Wec_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    p = vProfs->pArray + uVar2;
    if (1 < iVar3) {
      iVar7 = 1;
      lVar4 = 0;
      do {
        if ((char)p_00->pArray[lVar4 * 2 + 1] == (char)uVar8) {
          if (p->nSize <= (int)lVar4) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar3 = p->pArray[lVar4];
          if (((long)iVar3 < 0) || (vStore->nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          iVar3 = Nf_StoCellIsDominated(pCell,pFans,vStore->pArray + iVar3);
          if (iVar3 != 0) {
            return;
          }
          iVar3 = p_00->nSize;
        }
        lVar4 = lVar4 + 1;
        iVar7 = iVar7 + 2;
      } while (iVar7 < iVar3);
    }
  }
  if (fPinPerm == 0) {
    iVar3 = p_00->nSize;
    uVar2 = *(uint *)&pCell->field_0x10;
    if (fPinQuick == 0) {
      if (1 < iVar3) {
        lVar4 = 1;
        do {
          if ((p_00->pArray[lVar4 + -1] == (uVar2 & 0x3ffffff)) &&
             (((p_00->pArray[lVar4] ^ uVar8) & 0xfe) == 0)) {
            return;
          }
          lVar4 = lVar4 + 2;
        } while ((int)lVar4 < iVar3);
      }
    }
    else if (1 < iVar3) {
      lVar4 = 1;
      do {
        if ((p_00->pArray[lVar4 + -1] == (uVar2 & 0x3ffffff)) &&
           (*(int *)((long)Abc_TtBitCount8 + (ulong)(p_00->pArray[lVar4] & 0xfe) * 2) ==
            Abc_TtBitCount8[uVar8 >> 1 & 0x7f])) {
          return;
        }
        lVar4 = lVar4 + 2;
      } while ((int)lVar4 < iVar3);
    }
  }
  else {
    uVar2 = *(uint *)&pCell->field_0x10;
  }
  Vec_IntPush(p_00,uVar2 & 0x3ffffff);
  Vec_IntPush(p_00,uVar8);
  if (fPinFilter != 0) {
    Vec_IntPush(p,vStore->nSize);
    Vec_IntPush(vStore,(int)pCell->AreaF);
    if (nFans != 0) {
      uVar6 = 0;
      do {
        if (pFans[uVar6] < 0) {
LAB_0078c03e:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        Vec_IntPush(vStore,pCell->iDelays[(uint)pFans[uVar6] >> 1]);
        uVar6 = uVar6 + 1;
      } while ((uint)nFans != uVar6);
    }
  }
  return;
}

Assistant:

void Nf_StoCreateGateAdd( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, Mio_Cell2_t * pCell, word uTruth, int * pFans, int nFans, Vec_Wec_t * vProfs, Vec_Int_t * vStore, int fPinFilter, int fPinPerm, int fPinQuick )
{
    Vec_Int_t * vArray, * vArrayProfs = NULL;
    int i, k, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( vTtMem, &uFunc );
    Nf_Cfg_t Mat = Nf_Int2Cfg(0);
    // get match array
    if ( iFunc == Vec_WecSize(vTt2Match) )
        Vec_WecPushLevel( vTt2Match );
    vArray = Vec_WecEntry( vTt2Match, iFunc );
    // create match
    Mat.fCompl = fCompl;
    assert( nFans == (int)pCell->nFanins );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(i << (Abc_Lit2Var(pFans[i]) << 2));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << Abc_Lit2Var(pFans[i]));
    }
    // check other profiles
    if ( fPinFilter )
    {
        // get profile array
        assert( Vec_WecSize(vTt2Match) == Vec_WecSize(vProfs) );
        if ( iFunc == Vec_WecSize(vProfs) )
            Vec_WecPushLevel( vProfs );
        vArrayProfs = Vec_WecEntry( vProfs, iFunc );
        assert( Vec_IntSize(vArray) == 2 * Vec_IntSize(vArrayProfs) );
        // skip dominated matches
        Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
            if ( Nf_Int2Cfg(Entry).Phase == Mat.Phase && Nf_Int2Cfg(Entry).fCompl == Mat.fCompl )
            {
                int Offset = Vec_IntEntry(vArrayProfs, i/2);
                int * pProf = Vec_IntEntryP(vStore, Offset);
                if ( Nf_StoCellIsDominated(pCell, pFans, pProf) )
                    return;
            }
    }
    // check pin permutation
    if ( !fPinPerm ) // do not use  pin-permutation (improves delay when pin-delays differ)
    {
        if ( fPinQuick ) // reduce the number of matches agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == (int)pCell->Id && Abc_TtBitCount8[Nf_Int2Cfg(Entry).Phase] == Abc_TtBitCount8[Mat.Phase] )
                    return;
        }
        else // reduce the number of matches less agressively
        {
            Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
                if ( GateId == (int)pCell->Id && Nf_Int2Cfg(Entry).Phase == Mat.Phase )
                    return;
        }
    }
    // save data and profile
    Vec_IntPush( vArray, pCell->Id );
    Vec_IntPush( vArray, Nf_Cfg2Int(Mat) );
    // add delay profile
    if ( fPinFilter )
    {
        Vec_IntPush( vArrayProfs, Vec_IntSize(vStore) );
        Vec_IntPush( vStore, Abc_Float2Int(pCell->AreaF) );
        for ( k = 0; k < nFans; k++ )
            Vec_IntPush( vStore, pCell->iDelays[Abc_Lit2Var(pFans[k])] );
    }
}